

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::sshl_ov(APInt *this,APInt *ShAmt,bool *Overflow)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  undefined8 in_RCX;
  ulong uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  APInt *R;
  APInt AVar7;
  
  bVar3 = ult((APInt *)Overflow,(ulong)ShAmt->BitWidth);
  *(bool *)in_RCX = !bVar3;
  if (bVar3) {
    bVar3 = operator[](ShAmt,ShAmt->BitWidth - 1);
    uVar1 = ShAmt->BitWidth;
    if (bVar3) {
      if (uVar1 < 0x41) {
        uVar5 = (ShAmt->U).VAL << (-(char)uVar1 & 0x3fU) ^ 0xffffffffffffffff;
        if (uVar5 == 0) {
          uVar4 = 0x40;
        }
        else {
          lVar2 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar4 = (uint)lVar2 ^ 0x3f;
        }
      }
      else {
        uVar4 = countLeadingOnesSlowCase(ShAmt);
      }
    }
    else if (uVar1 < 0x41) {
      uVar5 = (ShAmt->U).VAL;
      if (uVar5 == 0) {
        uVar4 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar4 = (uint)lVar2 ^ 0x3f;
      }
      uVar4 = (uVar1 - 0x40) + uVar4;
    }
    else {
      uVar4 = countLeadingZerosSlowCase(ShAmt);
    }
    bVar3 = ult((APInt *)Overflow,(ulong)uVar4);
    *(bool *)in_RCX = !bVar3;
    APInt(this,ShAmt);
    operator<<=(this,(APInt *)Overflow);
    uVar6 = extraout_RDX_00;
  }
  else {
    APInt(this,ShAmt->BitWidth,0,false);
    uVar6 = extraout_RDX;
  }
  AVar7._8_8_ = uVar6;
  AVar7.U.pVal = (uint64_t *)this;
  return AVar7;
}

Assistant:

APInt APInt::sshl_ov(const APInt &ShAmt, bool &Overflow) const {
  Overflow = ShAmt.uge(getBitWidth());
  if (Overflow)
    return APInt(BitWidth, 0);

  if (isNonNegative()) // Don't allow sign change.
    Overflow = ShAmt.uge(countLeadingZeros());
  else
    Overflow = ShAmt.uge(countLeadingOnes());

  return *this << ShAmt;
}